

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O1

int sexp_buffered_read_char(sexp ctx,sexp p)

{
  sexp psVar1;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  ssize_t sVar5;
  anon_union_24768_35_b8e82fc1_for_value *paVar6;
  sexp_sint_t n;
  sexp psVar7;
  sexp origbytes;
  sexp tmp;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp local_48;
  sexp local_40;
  sexp_gc_var_t local_38;
  sexp_gc_var_t local_28;
  
  local_40 = (sexp)0x43e;
  local_38.var = (sexp_conflict *)0x0;
  local_38.next = (sexp_gc_var_t *)0x0;
  local_48 = (sexp)0x43e;
  local_28.var = (sexp_conflict *)0x0;
  local_28.next = (sexp_gc_var_t *)0x0;
  psVar7 = (p->value).type.print;
  if (psVar7 < (sexp)(p->value).port.size) {
    (p->value).type.print = (sexp)((long)&psVar7->tag + 1);
    uVar2 = (uint)*(byte *)((long)&psVar7->tag + (long)&((p->value).type.setters)->tag);
  }
  else {
    uVar2 = 0xffffffff;
    if ((p->value).flonum_bits[0x28] != '\0') {
      psVar7 = (p->value).type.getters;
      if (psVar7 == (sexp)0x0) {
        psVar7 = (p->value).type.slots;
        if ((((ulong)psVar7 & 3) != 0) || (psVar7->tag != 0x12)) {
          psVar7 = (p->value).type.cpl;
          if (((ulong)psVar7 & 3) != 0) {
            return -1;
          }
          if (psVar7->tag != 10) {
            return -1;
          }
          if ((psVar7->value).type.name != (sexp)0x6) {
            return -1;
          }
          local_38.var = &local_40;
          local_28.next = &local_38;
          local_38.next = (ctx->value).context.saves;
          (ctx->value).context.saves = local_28.next;
          (ctx->value).context.saves = &local_28;
          psVar7 = (sexp)&DAT_00000009;
          local_28.var = &local_48;
          local_40 = sexp_list2(ctx,(sexp)&DAT_00000009,(sexp)&DAT_00002001);
          paVar6 = (anon_union_24768_35_b8e82fc1_for_value *)
                   &(((p->value).type.cpl)->value).type.slots;
          if ((p->value).flonum_bits[0x2a] != '\0') {
            paVar6 = &((paVar6->type).name)->value;
          }
          local_48 = (paVar6->type).name;
          local_40 = sexp_cons_op(ctx,psVar7,n,local_48,local_40);
          local_40 = sexp_apply(ctx,(((p->value).type.cpl)->value).type.getters,local_40);
          if ((long)local_40 < 10 || ((ulong)local_40 & 1) == 0) {
            (p->value).port.size = 0;
            uVar2 = 0xffffffff;
          }
          else {
            (p->value).port.offset = 4;
            (p->value).port.size = (long)local_40 >> 1;
            if ((p->value).flonum_bits[0x2a] == '\0') {
              psVar7 = (((p->value).type.cpl)->value).type.slots;
              psVar1 = (psVar7->value).type.name;
              if (local_48 != psVar1) {
                memcpy((p->value).type.setters,
                       (void *)((long)&psVar1->value + (long)&((psVar7->value).type.cpl)->value),
                       (long)local_40 >> 1);
              }
            }
            psVar7 = (p->value).type.print;
            uVar2 = 0xffffffff;
            if (psVar7 < (sexp)(p->value).port.size) {
              (p->value).type.print = (sexp)((long)&psVar7->tag + 1);
              uVar2 = (uint)*(byte *)((long)&psVar7->tag + (long)&((p->value).type.setters)->tag);
            }
          }
          (ctx->value).context.saves = local_38.next;
          return uVar2;
        }
        sVar5 = read((psVar7->value).promise.donep,&((p->value).type.setters)->markedp,0xffc);
        uVar2 = (uint)sVar5;
      }
      else {
        sVar4 = fread(&((p->value).type.setters)->markedp,1,0xffc,(FILE *)psVar7);
        uVar2 = (uint)sVar4;
      }
      if (-1 < (int)uVar2) {
        (p->value).port.offset = 4;
        uVar3 = uVar2 + 4;
        *(ulong *)((long)&p->value + 0x48) = (ulong)uVar3;
        uVar2 = 0xffffffff;
        if (4 < uVar3) {
          (p->value).port.offset = 5;
          uVar2 = (uint)(byte)((p->value).type.setters)->markedp;
        }
      }
    }
  }
  return uVar2;
}

Assistant:

int sexp_buffered_read_char (sexp ctx, sexp p) {
  sexp_gc_var2(tmp, origbytes);
  int res = 0;
  if (sexp_port_offset(p) < sexp_port_size(p)) {
    return ((unsigned char*)sexp_port_buf(p))[sexp_port_offset(p)++];
  } else if (!sexp_port_openp(p)) {
    return EOF;
  } else if (sexp_port_stream(p)) {
    res = fread(sexp_port_buf(p) + BUF_START, 1, SEXP_PORT_BUFFER_SIZE - BUF_START, sexp_port_stream(p));
    if (res >= 0) {
      sexp_port_offset(p) = BUF_START;
      sexp_port_size(p) = res + BUF_START;
      res = ((sexp_port_offset(p) < sexp_port_size(p))
             ? ((unsigned char*)sexp_port_buf(p))[sexp_port_offset(p)++] : EOF);
    }
  } else if (sexp_filenop(sexp_port_fd(p))) {
    res = read(sexp_port_fileno(p), sexp_port_buf(p) + BUF_START, SEXP_PORT_BUFFER_SIZE - BUF_START);
    if (res >= 0) {
      sexp_port_offset(p) = BUF_START;
      sexp_port_size(p) = res + BUF_START;
      res = ((sexp_port_offset(p) < sexp_port_size(p))
             ? ((unsigned char*)sexp_port_buf(p))[sexp_port_offset(p)++] : EOF);
    }
  } else if (sexp_port_customp(p)) {
    sexp_gc_preserve2(ctx, tmp, origbytes);
    tmp = sexp_list2(ctx, sexp_make_fixnum(BUF_START), sexp_make_fixnum(SEXP_PORT_BUFFER_SIZE));
    origbytes = sexp_port_binaryp(p) && !SEXP_USE_PACKED_STRINGS ? sexp_string_bytes(sexp_port_buffer(p)) : sexp_port_buffer(p);
    tmp = sexp_cons(ctx, origbytes, tmp);
    tmp = sexp_apply(ctx, sexp_port_reader(p), tmp);
    if (sexp_fixnump(tmp) && sexp_unbox_fixnum(tmp) > BUF_START) {
      sexp_port_offset(p) = BUF_START;
      sexp_port_size(p) = sexp_unbox_fixnum(tmp);
      if (!sexp_port_binaryp(p) && !SEXP_USE_PACKED_STRINGS
          && origbytes != sexp_string_bytes(sexp_port_buffer(p))) {
        /* handle resize */
        memcpy(sexp_port_buf(p), sexp_string_data(sexp_port_buffer(p)), sexp_port_size(p));
      }
      res = ((sexp_port_offset(p) < sexp_port_size(p))
             ? ((unsigned char*)sexp_port_buf(p))[sexp_port_offset(p)++] : EOF);
    } else {
      res = EOF;
      sexp_port_size(p) = 0;
    }
    sexp_gc_release2(ctx);
  } else {
    res = EOF;
  }
  return res;
}